

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

int htoi(char *str,int nb)

{
  uint uVar1;
  __int32_t **pp_Var2;
  ulong uVar3;
  int iVar4;
  
  if (nb < 1) {
    return 0;
  }
  pp_Var2 = __ctype_toupper_loc();
  uVar3 = 0;
  uVar1 = 0;
  do {
    iVar4 = (int)(char)(*pp_Var2)[str[uVar3]];
    if (iVar4 - 0x30U < 10) {
      uVar1 = uVar1 << 4 | iVar4 - 0x30U;
    }
    else {
      if (5 < iVar4 - 0x41U) {
        return -1;
      }
      uVar1 = (uVar1 * 0x10 + iVar4) - 0x37;
    }
    uVar3 = uVar3 + 1;
  } while ((uint)nb != uVar3);
  return uVar1;
}

Assistant:

int
htoi(char *str, int nb)
{
	char c;
	int val;
	int i;

	val = 0;

	for (i = 0; i < nb; i++) {
		 c = toupper(str[i]);

		if ((c >= '0') && (c <= '9'))
			val = (val << 4) + (c - '0');
		else if ((c >= 'A') && (c <= 'F'))
			val = (val << 4) + (c - 'A' + 10);
		else
			return (-1);
	}

	/* ok */
	return (val);
}